

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

string_view
google::protobuf::internal::TcParser::FieldName(TcParseTableBase *table,FieldEntry *field_entry)

{
  FieldEntry *pFVar1;
  char *name_data;
  string_view sVar2;
  size_t field_index;
  FieldEntry *field_entries;
  FieldEntry *field_entry_local;
  TcParseTableBase *table_local;
  
  pFVar1 = TcParseTableBase::field_entries_begin(table);
  name_data = TcParseTableBase::name_data(table);
  sVar2 = FindName(name_data,(ulong)(table->num_field_entries + 1),
                   ((long)field_entry - (long)pFVar1 >> 2) * -0x5555555555555555 + 1);
  return sVar2;
}

Assistant:

absl::string_view TcParser::FieldName(const TcParseTableBase* table,
                                      const FieldEntry* field_entry) {
  const FieldEntry* const field_entries = table->field_entries_begin();
  auto field_index = static_cast<size_t>(field_entry - field_entries);
  return FindName(table->name_data(), table->num_field_entries + 1,
                  field_index + 1);
}